

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLEventsSource.cpp
# Opt level: O0

Event * __thiscall
solitaire::events::SDLEventsSource::getEvent(Event *__return_storage_ptr__,SDLEventsSource *this)

{
  int iVar1;
  pointer pWVar2;
  NoEvents local_6e;
  Quit local_6d;
  MouseMove local_6c;
  MouseLeftButtonUp local_61;
  MouseLeftButtonDown local_60;
  int local_58 [2];
  SDL_Event event;
  SDLEventsSource *this_local;
  
  event._48_8_ = __return_storage_ptr__;
  while( true ) {
    pWVar2 = std::
             unique_ptr<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
             ::operator->((unique_ptr<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
                           *)&(__return_storage_ptr__->
                              super__Variant_base<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
                              ).
                              super__Move_assign_alias<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
                              .
                              super__Copy_assign_alias<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
                              .
                              super__Move_ctor_alias<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
                              .
                              super__Copy_ctor_alias<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
                              .
                              super__Variant_storage_alias<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
                              ._M_index);
    iVar1 = (*pWVar2->_vptr_Wrapper[4])(pWVar2,local_58);
    if (iVar1 == 0) {
      std::
      variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
      ::variant<solitaire::events::NoEvents,void,void,solitaire::events::NoEvents,void>
                ((variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
                  *)((long)&this_local + 4),&local_6e);
      return stack0xffffffffffffffec;
    }
    if (local_58[0] == 0x100) break;
    if (local_58[0] == 0x400) {
      local_6c.position.x = event.motion.which;
      local_6c.position.y = event.display.data1;
      std::
      variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
      ::variant<solitaire::events::MouseMove,void,void,solitaire::events::MouseMove,void>
                ((variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
                  *)((long)&this_local + 4),&local_6c);
      return stack0xffffffffffffffec;
    }
    if (local_58[0] == 0x401) {
      if (event.padding[8] == '\x01') {
        local_60.position.x = event.motion.which;
        local_60.position.y = event.display.data1;
        std::
        variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
        ::
        variant<solitaire::events::MouseLeftButtonDown,void,void,solitaire::events::MouseLeftButtonDown,void>
                  ((variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
                    *)((long)&this_local + 4),&local_60);
        return stack0xffffffffffffffec;
      }
    }
    else if ((local_58[0] == 0x402) && (event.padding[8] == '\x01')) {
      std::
      variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
      ::
      variant<solitaire::events::MouseLeftButtonUp,void,void,solitaire::events::MouseLeftButtonUp,void>
                ((variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
                  *)((long)&this_local + 4),&local_61);
      return stack0xffffffffffffffec;
    }
  }
  std::
  variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
  ::variant<solitaire::events::Quit,void,void,solitaire::events::Quit,void>
            ((variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
              *)((long)&this_local + 4),&local_6d);
  return stack0xffffffffffffffec;
}

Assistant:

Event SDLEventsSource::getEvent() const {
    SDL_Event event;

    while (sdl->pollEvent(event)) {
        switch (event.type) {
        case SDL_MOUSEBUTTONDOWN:
            if (event.button.button == SDL_BUTTON_LEFT)
                return MouseLeftButtonDown {Position {event.button.x, event.button.y}};
            break;

        case SDL_MOUSEBUTTONUP:
            if (event.button.button == SDL_BUTTON_LEFT)
                return MouseLeftButtonUp {};
            break;

        case SDL_MOUSEMOTION:
            return MouseMove {event.motion.x, event.motion.y};

        case SDL_QUIT:
            return Quit {};
        }
    }

    return NoEvents {};
}